

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O1

tuple<int,_char,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
camp::tuple_cat_pair<camp::tuple<int,char>&,camp::tuple<float,std::__cxx11::string>&,0l,1l,0l,1l>
          (tuple<int,_char,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,camp *this,float *l)

{
  (__return_storage_ptr__->base).super_tuple_storage<0L,_int,_false>.val = *(int *)this;
  (__return_storage_ptr__->base).super_tuple_storage<1L,_char,_false>.val = (char)this[4];
  (__return_storage_ptr__->base).super_tuple_storage<2L,_float,_false>.val = *l;
  (__return_storage_ptr__->base).
  super_tuple_storage<3L,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  .val._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->base).
                 super_tuple_storage<3L,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 .val.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(__return_storage_ptr__->base).
              super_tuple_storage<3L,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ,*(long *)(l + 2),*(long *)(l + 4) + *(long *)(l + 2));
  return __return_storage_ptr__;
}

Assistant:

CAMP_HOST_DEVICE constexpr auto tuple_cat_pair(L&& l,
                                               camp::idx_seq<Lidx...>,
                                               R&& r,
                                               camp::idx_seq<Ridx...>) noexcept
{
  return ::camp::tuple<camp::at_v<typename std::decay_t<L>::TList, Lidx>...,
                       camp::at_v<typename std::decay_t<R>::TList, Ridx>...>(
      ::camp::get<Lidx>(std::forward<L>(l))...,
      ::camp::get<Ridx>(std::forward<R>(r))...);
}